

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.cc
# Opt level: O2

void __thiscall el::Logger::Logger(Logger *this,Logger *logger)

{
  _Rb_tree_header *p_Var1;
  
  (this->super_ThreadSafe)._vptr_ThreadSafe = (_func_int **)&PTR_acquireLock_0019b570;
  (this->super_Loggable)._vptr_Loggable = (_func_int **)&PTR__Logger_0019b5b0;
  (this->m_id)._M_dataplus._M_p = (pointer)&(this->m_id).field_2;
  (this->m_id)._M_string_length = 0;
  (this->m_id).field_2._M_local_buf[0] = '\0';
  std::__cxx11::stringstream::stringstream((stringstream *)&this->m_stream);
  (this->m_parentApplicationName)._M_dataplus._M_p =
       (pointer)&(this->m_parentApplicationName).field_2;
  (this->m_parentApplicationName)._M_string_length = 0;
  (this->m_parentApplicationName).field_2._M_local_buf[0] = '\0';
  *(pointer *)
   ((long)&(this->m_configurations).
           super_RegistryWithPred<el::Configuration,_el::Configuration::Predicate>.
           super_AbstractRegistry<el::Configuration,_std::vector<el::Configuration_*,_std::allocator<el::Configuration_*>_>_>
           .m_list.super__Vector_base<el::Configuration_*,_std::allocator<el::Configuration_*>_>.
           _M_impl.super__Vector_impl_data + 0x10) = (pointer)0x0;
  (this->m_configurations).super_RegistryWithPred<el::Configuration,_el::Configuration::Predicate>.
  super_AbstractRegistry<el::Configuration,_std::vector<el::Configuration_*,_std::allocator<el::Configuration_*>_>_>
  .m_list.super__Vector_base<el::Configuration_*,_std::allocator<el::Configuration_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  *(pointer *)
   ((long)&(this->m_configurations).
           super_RegistryWithPred<el::Configuration,_el::Configuration::Predicate>.
           super_AbstractRegistry<el::Configuration,_std::vector<el::Configuration_*,_std::allocator<el::Configuration_*>_>_>
           .m_list.super__Vector_base<el::Configuration_*,_std::allocator<el::Configuration_*>_>.
           _M_impl.super__Vector_impl_data + 8) = (pointer)0x0;
  (this->m_configurations).super_RegistryWithPred<el::Configuration,_el::Configuration::Predicate>.
  super_AbstractRegistry<el::Configuration,_std::vector<el::Configuration_*,_std::allocator<el::Configuration_*>_>_>
  .super_ThreadSafe._vptr_ThreadSafe = (_func_int **)&PTR_acquireLock_0019b4d8;
  (this->m_configurations).m_configurationFile._M_dataplus._M_p =
       (pointer)&(this->m_configurations).m_configurationFile.field_2;
  (this->m_configurations).m_configurationFile._M_string_length = 0;
  (this->m_configurations).m_configurationFile.field_2._M_local_buf[0] = '\0';
  (this->m_configurations).m_isFromFile = false;
  p_Var1 = &(this->m_unflushedCount)._M_t._M_impl.super__Rb_tree_header;
  (this->m_unflushedCount)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_unflushedCount)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->m_unflushedCount)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header
  ;
  (this->m_unflushedCount)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->m_unflushedCount)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->m_logBuilder).super___shared_ptr<el::LogBuilder,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->m_logBuilder).super___shared_ptr<el::LogBuilder,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  base::utils::safeDelete<el::base::TypedConfigurations>(&this->m_typedConfigurations);
  std::__cxx11::string::_M_assign((string *)&this->m_id);
  this->m_typedConfigurations = logger->m_typedConfigurations;
  std::__cxx11::string::_M_assign((string *)&this->m_parentApplicationName);
  this->m_isConfigured = logger->m_isConfigured;
  Configurations::operator=(&this->m_configurations,&logger->m_configurations);
  base::utils::std::
  _Rb_tree<el::Level,_std::pair<const_el::Level,_unsigned_int>,_std::_Select1st<std::pair<const_el::Level,_unsigned_int>_>,_std::less<el::Level>,_std::allocator<std::pair<const_el::Level,_unsigned_int>_>_>
  ::operator=(&(this->m_unflushedCount)._M_t,&(logger->m_unflushedCount)._M_t);
  this->m_logStreamsReference = logger->m_logStreamsReference;
  return;
}

Assistant:

Logger::Logger(const Logger& logger) {
  base::utils::safeDelete(m_typedConfigurations);
  m_id = logger.m_id;
  m_typedConfigurations = logger.m_typedConfigurations;
  m_parentApplicationName = logger.m_parentApplicationName;
  m_isConfigured = logger.m_isConfigured;
  m_configurations = logger.m_configurations;
  m_unflushedCount = logger.m_unflushedCount;
  m_logStreamsReference = logger.m_logStreamsReference;
}